

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qurl.cpp
# Opt level: O0

size_t qHash(QUrl *url,size_t seed)

{
  size_t seed_00;
  size_t sVar1;
  QString *key;
  ulong uVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  long *in_RDI;
  size_t in_stack_ffffffffffffffa8;
  size_t in_stack_ffffffffffffffb0;
  QString *in_stack_ffffffffffffffb8;
  undefined8 local_8;
  
  if (*in_RDI == 0) {
    local_8 = qHash((int)(in_stack_ffffffffffffffb0 >> 0x20),in_stack_ffffffffffffffa8);
  }
  else {
    seed_00 = qHash(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
    sVar1 = qHash(in_stack_ffffffffffffffb8,seed_00);
    key = (QString *)(seed_00 ^ sVar1);
    sVar1 = qHash(key,seed_00);
    uVar2 = (ulong)key ^ sVar1;
    sVar1 = qHash(key,seed_00);
    sVar3 = qHash((int)(seed_00 >> 0x20),in_stack_ffffffffffffffa8);
    sVar4 = qHash(key,seed_00);
    sVar5 = qHash(key,seed_00);
    local_8 = qHash(key,seed_00);
    local_8 = uVar2 ^ sVar1 ^ sVar3 ^ sVar4 ^ sVar5 ^ local_8;
  }
  return local_8;
}

Assistant:

size_t qHash(const QUrl &url, size_t seed) noexcept
{
    if (!url.d)
        return qHash(-1, seed); // the hash of an unset port (-1)

    return qHash(url.d->scheme) ^
            qHash(url.d->userName) ^
            qHash(url.d->password) ^
            qHash(url.d->host) ^
            qHash(url.d->port, seed) ^
            qHash(url.d->path) ^
            qHash(url.d->query) ^
            qHash(url.d->fragment);
}